

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_assign.h
# Opt level: O3

void dlib::blas_bindings::
     matrix_assign_blas<float,dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>>
               (assignable_ptr_matrix<float> *dest,
               matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>
               *src)

{
  RHS_ref_type pmVar1;
  long lVar2;
  float *pfVar3;
  long lVar4;
  float *pfVar5;
  long lVar6;
  matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout> temp;
  matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
  local_38;
  
  if ((dest->ptr != (src->lhs->op).ptr) &&
     ((pmVar1 = src->rhs, (pmVar1->data).nc_ == 0 || (pmVar1->data).nr_ == 0 ||
      (dest->ptr != (pmVar1->data).data)))) {
    matrix_assign_blas_helper<dlib::assignable_ptr_matrix<float>,dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>,void>
    ::
    assign<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>
              (dest,src,1.0,false,false);
    return;
  }
  matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>::
  matrix(&local_38,dest->height,dest->width);
  matrix_assign_blas_helper<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>,void>
  ::
  assign<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>
            (&local_38,src,1.0,false,false);
  if (0 < local_38.data.nr_) {
    lVar2 = dest->width;
    pfVar3 = dest->ptr;
    lVar4 = 0;
    pfVar5 = local_38.data.data;
    do {
      if (0 < local_38.data.nc_) {
        lVar6 = 0;
        do {
          pfVar3[lVar6] = pfVar5[lVar6];
          lVar6 = lVar6 + 1;
        } while (local_38.data.nc_ != lVar6);
      }
      lVar4 = lVar4 + 1;
      pfVar3 = pfVar3 + lVar2;
      pfVar5 = pfVar5 + local_38.data.nc_;
    } while (lVar4 != local_38.data.nr_);
  }
  if (local_38.data.data != (float *)0x0) {
    operator_delete__(local_38.data.data);
  }
  return;
}

Assistant:

void matrix_assign_blas (
            assignable_ptr_matrix<T>& dest,
            const src_exp& src
        )
        {
            if (src.aliases(mat(dest.ptr,dest.height,dest.width)))
            {
                matrix<T> temp(dest.nr(),dest.nc());
                matrix_assign_blas_proxy(temp,src,1,false, false);
                matrix_assign_default(dest,temp);
            }
            else
            {
                matrix_assign_blas_proxy(dest,src,1,false, false);
            }
        }